

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O0

WebPChunk * ChunkDelete(WebPChunk *chunk)

{
  WebPChunk *pWVar1;
  WebPChunk *next;
  WebPChunk *in_stack_ffffffffffffffe8;
  
  pWVar1 = ChunkRelease(in_stack_ffffffffffffffe8);
  WebPSafeFree((void *)0x108922);
  return pWVar1;
}

Assistant:

WebPChunk* ChunkDelete(WebPChunk* const chunk) {
  WebPChunk* const next = ChunkRelease(chunk);
  WebPSafeFree(chunk);
  return next;
}